

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  TValue *pTVar2;
  StkId pTVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *__s;
  lua_Integer lVar7;
  TValue *pTVar8;
  char *pcVar9;
  char *pcVar10;
  size_t __n;
  long lVar11;
  TValue *i_o;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  size_t l2;
  size_t l1;
  MatchState ms;
  ulong local_260;
  ulong local_258;
  MatchState local_250;
  
  pcVar6 = luaL_checklstring(L,1,&local_258);
  __s = luaL_checklstring(L,2,&local_260);
  lVar7 = luaL_optinteger(L,3,1);
  lVar11 = (lVar7 >> 0x3f & local_258 + 1) + lVar7;
  lVar13 = 0;
  if (0 < lVar11) {
    lVar13 = lVar11;
  }
  uVar14 = lVar13 - 1U;
  if (local_258 <= lVar13 - 1U) {
    uVar14 = local_258;
  }
  if (lVar11 < 1) {
    uVar14 = 0;
  }
  if (find != 0) {
    pTVar2 = L->top;
    pTVar8 = &luaO_nilobject_;
    if (L->base + 3 < pTVar2) {
      pTVar8 = L->base + 3;
    }
    if (((pTVar8->tt != 0) && ((pTVar8->tt != 1 || ((pTVar8->value).b != 0)))) ||
       (pcVar9 = strpbrk(__s,"^$*+?.([%-"), pcVar9 == (char *)0x0)) {
      pcVar9 = pcVar6 + uVar14;
      if (local_260 != 0) {
        if (local_260 <= local_258 - uVar14) {
          __n = local_260 - 1;
          pcVar12 = (char *)((local_258 - uVar14) - __n);
          if (pcVar12 != (char *)0x0) {
            cVar1 = *__s;
            pcVar10 = pcVar9;
            do {
              pcVar9 = (char *)memchr(pcVar10,(int)cVar1,(size_t)pcVar12);
              if (pcVar9 == (char *)0x0) break;
              __s1 = pcVar9 + 1;
              iVar4 = bcmp(__s1,__s + 1,__n);
              if (iVar4 == 0) goto LAB_00112d5a;
              pcVar12 = pcVar10 + ((long)pcVar12 - (long)__s1);
              pcVar10 = __s1;
            } while (pcVar12 != (char *)0x0);
            pcVar9 = (char *)0x0;
            goto LAB_00112d5a;
          }
        }
        pcVar9 = (char *)0x0;
      }
LAB_00112d5a:
      if (pcVar9 != (char *)0x0) {
        (pTVar2->value).n = (double)(long)(pcVar9 + (1 - (long)pcVar6));
        pTVar2->tt = 3;
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        pTVar3[1].value.n = (double)(long)(pcVar9 + (local_260 - (long)pcVar6));
        pTVar3[1].tt = 3;
        L->top = L->top + 1;
        return 2;
      }
      goto LAB_00112dac;
    }
  }
  cVar1 = *__s;
  pcVar12 = pcVar6 + local_258;
  pcVar9 = pcVar6 + uVar14;
  local_250.src_init = pcVar6;
  local_250.src_end = pcVar12;
  local_250.L = L;
  do {
    uVar14 = uVar14 + 1;
    local_250.level = 0;
    pcVar10 = match(&local_250,pcVar9,__s + (cVar1 == '^'));
    if (pcVar10 != (char *)0x0) {
      if (find == 0) {
        uVar5 = push_captures(&local_250,pcVar9,pcVar10);
        pcVar12 = (char *)(ulong)uVar5;
      }
      else {
        pTVar3 = L->top;
        (pTVar3->value).n = (double)(long)uVar14;
        pTVar3->tt = 3;
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        pTVar3[1].value.n = (double)((long)pcVar10 - (long)pcVar6);
        pTVar3[1].tt = 3;
        L->top = L->top + 1;
        iVar4 = push_captures(&local_250,(char *)0x0,(char *)0x0);
        pcVar12 = (char *)(ulong)(iVar4 + 2);
      }
    }
    if (pcVar10 != (char *)0x0) {
      return (int)pcVar12;
    }
  } while ((cVar1 != '^') && (bVar15 = pcVar9 < local_250.src_end, pcVar9 = pcVar9 + 1, bVar15));
LAB_00112dac:
  pTVar3 = L->top;
  pTVar3->tt = 0;
  L->top = pTVar3 + 1;
  return 1;
}

Assistant:

static int str_find_aux(lua_State*L,int find){
size_t l1,l2;
const char*s=luaL_checklstring(L,1,&l1);
const char*p=luaL_checklstring(L,2,&l2);
ptrdiff_t init=posrelat(luaL_optinteger(L,3,1),l1)-1;
if(init<0)init=0;
else if((size_t)(init)>l1)init=(ptrdiff_t)l1;
if(find&&(lua_toboolean(L,4)||
strpbrk(p,"^$*+?.([%-")==NULL)){
const char*s2=lmemfind(s+init,l1-init,p,l2);
if(s2){
lua_pushinteger(L,s2-s+1);
lua_pushinteger(L,s2-s+l2);
return 2;
}
}
else{
MatchState ms;
int anchor=(*p=='^')?(p++,1):0;
const char*s1=s+init;
ms.L=L;
ms.src_init=s;
ms.src_end=s+l1;
do{
const char*res;
ms.level=0;
if((res=match(&ms,s1,p))!=NULL){
if(find){
lua_pushinteger(L,s1-s+1);
lua_pushinteger(L,res-s);
return push_captures(&ms,NULL,0)+2;
}
else
return push_captures(&ms,s1,res);
}
}while(s1++<ms.src_end&&!anchor);
}
lua_pushnil(L);
return 1;
}